

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O2

void xSAT_SolverCancelUntil(xSAT_Solver_t *s,int Level)

{
  int iVar1;
  Vec_Str_t *p;
  xSAT_Heap_t *h;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int nCapMin;
  Vec_Int_t *pVVar7;
  
  pVVar7 = s->vTrailLim;
  if (pVVar7->nSize <= Level) {
    return;
  }
  iVar6 = s->vTrail->nSize;
  do {
    iVar3 = Vec_IntEntry(pVVar7,Level);
    if (iVar6 <= iVar3) {
      iVar6 = Vec_IntEntry(s->vTrailLim,Level);
      s->iQhead = iVar6;
      pVVar7 = s->vTrail;
      iVar6 = Vec_IntEntry(s->vTrailLim,Level);
      Vec_IntShrink(pVVar7,iVar6);
      Vec_IntShrink(s->vTrailLim,Level);
      return;
    }
    iVar6 = iVar6 + -1;
    iVar3 = Vec_IntEntry(s->vTrail,iVar6);
    iVar3 = iVar3 >> 1;
    Vec_StrWriteEntry(s->vAssigns,iVar3,'\x03');
    Vec_IntWriteEntry(s->vReasons,iVar3,-1);
    p = s->vPolarity;
    iVar4 = Vec_IntEntry(s->vTrail,iVar6);
    Vec_StrWriteEntry(p,iVar3,(byte)iVar4 & 1);
    iVar4 = xSAT_HeapInHeap(s->hOrder,iVar3);
    if (iVar4 == 0) {
      h = s->hOrder;
      pVVar7 = h->vIndices;
      iVar4 = pVVar7->nSize;
      if (iVar4 <= iVar3) {
        iVar1 = iVar3 + 1;
        iVar2 = pVVar7->nCap * 2;
        nCapMin = iVar1;
        if ((iVar2 <= iVar3) || (nCapMin = iVar2, pVVar7->nCap <= iVar3)) {
          Vec_IntGrow(pVVar7,nCapMin);
          iVar4 = pVVar7->nSize;
        }
        for (lVar5 = (long)iVar4; lVar5 < iVar1; lVar5 = lVar5 + 1) {
          pVVar7->pArray[lVar5] = -1;
        }
        pVVar7->nSize = iVar1;
      }
      iVar4 = xSAT_HeapInHeap(h,iVar3);
      if (iVar4 != 0) {
        __assert_fail("!xSAT_HeapInHeap( p, n )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatHeap.h"
                      ,0xe6,"void xSAT_HeapInsert(xSAT_Heap_t *, int)");
      }
      Vec_IntWriteEntry(h->vIndices,iVar3,h->vHeap->nSize);
      Vec_IntPush(h->vHeap,iVar3);
      iVar3 = Vec_IntEntry(h->vIndices,iVar3);
      xSAT_HeapPercolateUp(h,iVar3);
    }
    pVVar7 = s->vTrailLim;
  } while( true );
}

Assistant:

void xSAT_SolverCancelUntil( xSAT_Solver_t * s, int Level )
{
    int c;

    if ( xSAT_SolverDecisionLevel( s ) <= Level )
        return;

    for ( c = Vec_IntSize( s->vTrail ) - 1; c >= Vec_IntEntry( s->vTrailLim, Level ); c-- )
    {
        int Var = xSAT_Lit2Var( Vec_IntEntry( s->vTrail, c ) );

        Vec_StrWriteEntry( s->vAssigns, Var, VarX );
        Vec_IntWriteEntry( s->vReasons, Var, ( int ) CRefUndef );
        Vec_StrWriteEntry( s->vPolarity, Var, ( char )xSAT_LitSign( Vec_IntEntry( s->vTrail, c ) ) );

        if ( !xSAT_HeapInHeap( s->hOrder, Var ) )
            xSAT_HeapInsert( s->hOrder, Var );
    }

    s->iQhead = Vec_IntEntry( s->vTrailLim, Level );
    Vec_IntShrink( s->vTrail, Vec_IntEntry( s->vTrailLim, Level ) );
    Vec_IntShrink( s->vTrailLim, Level );
}